

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  byte bVar22;
  byte bVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  long lVar28;
  uint *puVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  ushort uVar36;
  byte bVar37;
  undefined4 uVar38;
  NodeRef root;
  bool bVar39;
  ulong uVar40;
  float fVar41;
  float fVar71;
  float fVar72;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar138;
  float fVar141;
  float fVar143;
  undefined1 auVar139 [16];
  float fVar142;
  float fVar144;
  undefined1 auVar140 [16];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  TravRayK<4,_true> tray;
  vfloat<8> upper_x;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  byte local_3988;
  Precalculations local_3969;
  RayK<4> *local_3968;
  long local_3960;
  uint local_3958;
  uint local_3954;
  undefined1 local_3950 [16];
  RayK<4> *local_3938;
  ulong *local_3930;
  undefined4 local_3924;
  RTCFilterFunctionNArguments local_3920;
  ulong local_38f0;
  long local_38e8;
  undefined1 local_38e0 [32];
  BVH *local_38c0;
  Intersectors *local_38b8;
  long local_38b0;
  long local_38a8;
  long local_38a0;
  ulong local_3898;
  undefined1 local_3890 [16];
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3880;
  undefined1 local_3850 [16];
  undefined1 local_3840 [16];
  undefined1 local_3830 [16];
  undefined1 local_3820 [8];
  float fStack_3818;
  float fStack_3814;
  undefined1 local_3810 [8];
  float fStack_3808;
  float fStack_3804;
  undefined1 local_3800 [16];
  int local_37f0;
  int iStack_37ec;
  int iStack_37e8;
  int iStack_37e4;
  uint local_37e0;
  uint uStack_37dc;
  uint uStack_37d8;
  uint uStack_37d4;
  uint local_37d0;
  uint uStack_37cc;
  uint uStack_37c8;
  uint uStack_37c4;
  undefined1 local_37c0 [16];
  undefined1 local_37b0 [16];
  RTCHitN local_37a0 [16];
  undefined1 auStack_3790 [16];
  undefined1 local_3780 [8];
  float fStack_3778;
  float fStack_3774;
  undefined1 local_3770 [16];
  undefined1 local_3760 [16];
  undefined1 local_3750 [16];
  undefined1 local_3740 [16];
  uint local_3730;
  uint uStack_372c;
  uint uStack_3728;
  uint uStack_3724;
  uint uStack_3720;
  uint uStack_371c;
  uint uStack_3718;
  uint uStack_3714;
  undefined1 local_3700 [32];
  undefined1 local_36e0 [32];
  undefined1 local_36b0 [16];
  undefined1 local_36a0 [16];
  undefined1 local_3690 [16];
  undefined1 local_3680 [16];
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [32];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 local_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 local_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 local_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 local_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_34f8 = (((BVH *)This->ptr)->root).ptr;
  if (local_34f8 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar42 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar46 = ZEXT816(0) << 0x40;
      uVar12 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar46,5);
      uVar40 = vpcmpeqd_avx512vl(auVar42,(undefined1  [16])valid_i->field_0);
      uVar40 = ((byte)uVar12 & 0xf) & uVar40;
      bVar27 = (byte)uVar40;
      if (bVar27 != 0) {
        local_3880._0_8_ = *(undefined8 *)ray;
        local_3880._8_8_ = *(undefined8 *)(ray + 8);
        local_3880._16_8_ = *(undefined8 *)(ray + 0x10);
        local_3880._24_8_ = *(undefined8 *)(ray + 0x18);
        local_3880._32_8_ = *(undefined8 *)(ray + 0x20);
        local_3880._40_8_ = *(undefined8 *)(ray + 0x28);
        local_3850 = *(undefined1 (*) [16])(ray + 0x40);
        local_3840 = *(undefined1 (*) [16])(ray + 0x50);
        local_3830 = *(undefined1 (*) [16])(ray + 0x60);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar146 = ZEXT1664(auVar42);
        auVar43 = vandps_avx512vl(local_3850,auVar42);
        auVar61._8_4_ = 0x219392ef;
        auVar61._0_8_ = 0x219392ef219392ef;
        auVar61._12_4_ = 0x219392ef;
        uVar32 = vcmpps_avx512vl(auVar43,auVar61,1);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar147 = ZEXT1664(auVar43);
        auVar44 = vdivps_avx512vl(auVar43,local_3850);
        auVar45 = vandps_avx512vl(local_3840,auVar42);
        uVar30 = vcmpps_avx512vl(auVar45,auVar61,1);
        auVar45 = vdivps_avx512vl(auVar43,local_3840);
        auVar42 = vandps_avx512vl(local_3830,auVar42);
        uVar25 = vcmpps_avx512vl(auVar42,auVar61,1);
        auVar42 = vdivps_avx512vl(auVar43,local_3830);
        bVar39 = (bool)((byte)uVar32 & 1);
        local_3820._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        local_3820._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        fStack_3818 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._8_4_);
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        fStack_3814 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._12_4_);
        bVar39 = (bool)((byte)uVar30 & 1);
        local_3810._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar45._0_4_;
        bVar39 = (bool)((byte)(uVar30 >> 1) & 1);
        local_3810._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar45._4_4_;
        bVar39 = (bool)((byte)(uVar30 >> 2) & 1);
        fStack_3808 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar45._8_4_);
        bVar39 = (bool)((byte)(uVar30 >> 3) & 1);
        fStack_3804 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar45._12_4_);
        bVar39 = (bool)((byte)uVar25 & 1);
        local_3800._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar42._0_4_;
        bVar39 = (bool)((byte)(uVar25 >> 1) & 1);
        local_3800._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar42._4_4_;
        bVar39 = (bool)((byte)(uVar25 >> 2) & 1);
        local_3800._8_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar42._8_4_;
        bVar39 = (bool)((byte)(uVar25 >> 3) & 1);
        local_3800._12_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar42._12_4_;
        uVar32 = vcmpps_avx512vl(_local_3820,auVar46,1);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_37f0 = (uint)((byte)uVar32 & 1) * auVar42._0_4_;
        iStack_37ec = (uint)((byte)(uVar32 >> 1) & 1) * auVar42._4_4_;
        iStack_37e8 = (uint)((byte)(uVar32 >> 2) & 1) * auVar42._8_4_;
        iStack_37e4 = (uint)((byte)(uVar32 >> 3) & 1) * auVar42._12_4_;
        local_3924 = (undefined4)uVar40;
        uVar32 = vcmpps_avx512vl(_local_3810,auVar46,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar39 = (bool)((byte)uVar32 & 1);
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        local_37e0 = (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * 0x60;
        uStack_37dc = (uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * 0x60;
        uStack_37d8 = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * 0x60;
        uStack_37d4 = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * 0x60;
        uVar32 = vcmpps_avx512vl(local_3800,auVar46,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar39 = (bool)((byte)uVar32 & 1);
        bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        local_37d0 = (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * 0xa0;
        uStack_37cc = (uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * 0xa0;
        uStack_37c8 = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * 0xa0;
        uStack_37c4 = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * 0xa0;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar148 = ZEXT1664(local_2370);
        auVar42 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar46);
        local_37c0._0_4_ =
             (uint)(bVar27 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar27 & 1) * local_2370._0_4_;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_37c0._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_2370._4_4_;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_37c0._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * local_2370._8_4_;
        bVar39 = SUB81(uVar40 >> 3,0);
        local_37c0._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * local_2370._12_4_;
        auVar42 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar46);
        local_37b0._0_4_ =
             (uint)(bVar27 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar27 & 1) * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_37b0._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_37b0._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = SUB81(uVar40 >> 3,0);
        local_37b0._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * -0x800000;
        local_38b8 = This;
        local_38c0 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar32 = 3;
        }
        else {
          uVar32 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_3938 = ray + 0x80;
        uVar36 = (ushort)uVar40 ^ 0xf;
        pauVar35 = (undefined1 (*) [16])local_2350;
        local_3500 = 0xfffffffffffffff8;
        local_2360 = local_37c0;
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar149 = ZEXT1664(auVar42);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar150 = ZEXT1664(auVar42);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar151 = ZEXT1664(auVar42);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar145 = ZEXT1664(auVar42);
        local_38f0 = uVar32;
        puVar31 = local_34f0;
        local_3968 = ray;
LAB_007796f6:
        do {
          local_3988 = (byte)uVar36;
          do {
            root.ptr = puVar31[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_0077ad21;
            puVar31 = puVar31 + -1;
            auVar42 = pauVar35[-1];
            auVar89 = ZEXT1664(auVar42);
            pauVar35 = pauVar35 + -1;
            uVar40 = vcmpps_avx512vl(auVar42,local_37b0,1);
          } while ((char)uVar40 == '\0');
          uVar38 = (undefined4)uVar40;
          local_3930 = puVar31;
          if (uVar32 < (uint)POPCOUNT(uVar38)) {
LAB_0077973f:
            do {
              local_3988 = (byte)uVar36;
              uVar40 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0077ad21;
                uVar12 = vcmpps_avx512vl(auVar89._0_16_,local_37b0,9);
                if ((char)uVar12 != '\0') {
                  bVar27 = local_3988 & 0xf;
                  local_38b0 = (ulong)((uint)root.ptr & 0xf) - 8;
                  if (local_38b0 != 0) {
                    uVar40 = root.ptr & 0xfffffffffffffff0;
                    bVar27 = bVar27 ^ 0xf;
                    lVar26 = 0;
                    local_3930 = puVar31;
                    do {
                      local_38a8 = lVar26;
                      lVar26 = lVar26 * 0x90;
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = *(ulong *)(uVar40 + 0x40 + lVar26);
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = *(ulong *)(uVar40 + 0x48 + lVar26);
                      uVar30 = vpcmpub_avx512vl(auVar42,auVar53,2);
                      if ((char)uVar30 != '\0') {
                        lVar26 = lVar26 + uVar40;
                        uVar30 = uVar30 & 0xff;
                        local_38a0 = lVar26;
                        do {
                          auVar54._8_8_ = 0;
                          auVar54._0_8_ = *(ulong *)(lVar26 + 0x40);
                          auVar80 = vpmovzxbd_avx2(auVar54);
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          uVar38 = *(undefined4 *)(lVar26 + 0x7c);
                          auVar86._4_4_ = uVar38;
                          auVar86._0_4_ = uVar38;
                          auVar86._8_4_ = uVar38;
                          auVar86._12_4_ = uVar38;
                          auVar86._16_4_ = uVar38;
                          auVar86._20_4_ = uVar38;
                          auVar86._24_4_ = uVar38;
                          auVar86._28_4_ = uVar38;
                          uVar38 = *(undefined4 *)(lVar26 + 0x70);
                          auVar94._4_4_ = uVar38;
                          auVar94._0_4_ = uVar38;
                          auVar94._8_4_ = uVar38;
                          auVar94._12_4_ = uVar38;
                          auVar94._16_4_ = uVar38;
                          auVar94._20_4_ = uVar38;
                          auVar94._24_4_ = uVar38;
                          auVar94._28_4_ = uVar38;
                          auVar42 = vfmadd213ps_fma(auVar80,auVar86,auVar94);
                          local_3600 = ZEXT1632(auVar42);
                          auVar55._8_8_ = 0;
                          auVar55._0_8_ = *(ulong *)(lVar26 + 0x48);
                          auVar80 = vpmovzxbd_avx2(auVar55);
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          auVar42 = vfmadd213ps_fma(auVar80,auVar86,auVar94);
                          _local_37a0 = ZEXT1632(auVar42);
                          auVar56._8_8_ = 0;
                          auVar56._0_8_ = *(ulong *)(lVar26 + 0x50);
                          auVar80 = vpmovzxbd_avx2(auVar56);
                          uVar38 = *(undefined4 *)(lVar26 + 0x80);
                          auVar87._4_4_ = uVar38;
                          auVar87._0_4_ = uVar38;
                          auVar87._8_4_ = uVar38;
                          auVar87._12_4_ = uVar38;
                          auVar87._16_4_ = uVar38;
                          auVar87._20_4_ = uVar38;
                          auVar87._24_4_ = uVar38;
                          auVar87._28_4_ = uVar38;
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          uVar38 = *(undefined4 *)(lVar26 + 0x74);
                          auVar95._4_4_ = uVar38;
                          auVar95._0_4_ = uVar38;
                          auVar95._8_4_ = uVar38;
                          auVar95._12_4_ = uVar38;
                          auVar95._16_4_ = uVar38;
                          auVar95._20_4_ = uVar38;
                          auVar95._24_4_ = uVar38;
                          auVar95._28_4_ = uVar38;
                          auVar42 = vfmadd213ps_fma(auVar80,auVar87,auVar95);
                          auVar80 = ZEXT1632(auVar42);
                          local_3920.valid = (int *)auVar80._0_8_;
                          local_3920.geometryUserPtr = (void *)auVar80._8_8_;
                          local_3920.context = (RTCRayQueryContext *)auVar80._16_8_;
                          local_3920.ray = (RTCRayN *)auVar80._24_8_;
                          auVar58._8_8_ = 0;
                          auVar58._0_8_ = *(ulong *)(lVar26 + 0x58);
                          auVar80 = vpmovzxbd_avx2(auVar58);
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          auVar42 = vfmadd213ps_fma(auVar80,auVar87,auVar95);
                          local_38e0 = ZEXT1632(auVar42);
                          auVar59._8_8_ = 0;
                          auVar59._0_8_ = *(ulong *)(lVar26 + 0x60);
                          auVar80 = vpmovzxbd_avx2(auVar59);
                          uVar38 = *(undefined4 *)(lVar26 + 0x84);
                          auVar88._4_4_ = uVar38;
                          auVar88._0_4_ = uVar38;
                          auVar88._8_4_ = uVar38;
                          auVar88._12_4_ = uVar38;
                          auVar88._16_4_ = uVar38;
                          auVar88._20_4_ = uVar38;
                          auVar88._24_4_ = uVar38;
                          auVar88._28_4_ = uVar38;
                          uVar38 = *(undefined4 *)(lVar26 + 0x78);
                          auVar96._4_4_ = uVar38;
                          auVar96._0_4_ = uVar38;
                          auVar96._8_4_ = uVar38;
                          auVar96._12_4_ = uVar38;
                          auVar96._16_4_ = uVar38;
                          auVar96._20_4_ = uVar38;
                          auVar96._24_4_ = uVar38;
                          auVar96._28_4_ = uVar38;
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          auVar42 = vfmadd213ps_fma(auVar80,auVar88,auVar96);
                          local_36e0 = ZEXT1632(auVar42);
                          auVar65._8_8_ = 0;
                          auVar65._0_8_ = *(ulong *)(lVar26 + 0x68);
                          auVar80 = vpmovzxbd_avx2(auVar65);
                          lVar28 = 0;
                          for (uVar25 = uVar30; (uVar25 & 1) == 0;
                              uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                            lVar28 = lVar28 + 1;
                          }
                          auVar80 = vcvtdq2ps_avx(auVar80);
                          auVar42 = vfmadd213ps_fma(auVar80,auVar88,auVar96);
                          local_3700 = ZEXT1632(auVar42);
                          uVar25 = (ulong)(uint)((int)lVar28 * 4);
                          uVar38 = *(undefined4 *)(local_3600 + uVar25);
                          auVar74._4_4_ = uVar38;
                          auVar74._0_4_ = uVar38;
                          auVar74._8_4_ = uVar38;
                          auVar74._12_4_ = uVar38;
                          auVar66._8_8_ = local_3880._8_8_;
                          auVar66._0_8_ = local_3880._0_8_;
                          auVar67._8_8_ = local_3880._24_8_;
                          auVar67._0_8_ = local_3880._16_8_;
                          auVar20._8_8_ = local_3880._40_8_;
                          auVar20._0_8_ = local_3880._32_8_;
                          auVar42 = vsubps_avx(auVar74,auVar66);
                          auVar75._0_4_ = (float)local_3820._0_4_ * auVar42._0_4_;
                          auVar75._4_4_ = (float)local_3820._4_4_ * auVar42._4_4_;
                          auVar75._8_4_ = fStack_3818 * auVar42._8_4_;
                          auVar75._12_4_ = fStack_3814 * auVar42._12_4_;
                          uVar38 = *(undefined4 *)((long)&local_3920.valid + uVar25);
                          auVar109._4_4_ = uVar38;
                          auVar109._0_4_ = uVar38;
                          auVar109._8_4_ = uVar38;
                          auVar109._12_4_ = uVar38;
                          auVar42 = vsubps_avx(auVar109,auVar67);
                          auVar110._0_4_ = (float)local_3810._0_4_ * auVar42._0_4_;
                          auVar110._4_4_ = (float)local_3810._4_4_ * auVar42._4_4_;
                          auVar110._8_4_ = fStack_3808 * auVar42._8_4_;
                          auVar110._12_4_ = fStack_3804 * auVar42._12_4_;
                          uVar38 = *(undefined4 *)(local_36e0 + uVar25);
                          auVar116._4_4_ = uVar38;
                          auVar116._0_4_ = uVar38;
                          auVar116._8_4_ = uVar38;
                          auVar116._12_4_ = uVar38;
                          auVar42 = vsubps_avx(auVar116,auVar20);
                          auVar117._0_4_ = local_3800._0_4_ * auVar42._0_4_;
                          auVar117._4_4_ = local_3800._4_4_ * auVar42._4_4_;
                          auVar117._8_4_ = local_3800._8_4_ * auVar42._8_4_;
                          auVar117._12_4_ = local_3800._12_4_ * auVar42._12_4_;
                          uVar38 = *(undefined4 *)(local_37a0 + uVar25);
                          auVar126._4_4_ = uVar38;
                          auVar126._0_4_ = uVar38;
                          auVar126._8_4_ = uVar38;
                          auVar126._12_4_ = uVar38;
                          auVar42 = vsubps_avx(auVar126,auVar66);
                          auVar83._0_4_ = (float)local_3820._0_4_ * auVar42._0_4_;
                          auVar83._4_4_ = (float)local_3820._4_4_ * auVar42._4_4_;
                          auVar83._8_4_ = fStack_3818 * auVar42._8_4_;
                          auVar83._12_4_ = fStack_3814 * auVar42._12_4_;
                          uVar38 = *(undefined4 *)(local_38e0 + uVar25);
                          auVar104._4_4_ = uVar38;
                          auVar104._0_4_ = uVar38;
                          auVar104._8_4_ = uVar38;
                          auVar104._12_4_ = uVar38;
                          auVar42 = vsubps_avx(auVar104,auVar67);
                          auVar90._0_4_ = (float)local_3810._0_4_ * auVar42._0_4_;
                          auVar90._4_4_ = (float)local_3810._4_4_ * auVar42._4_4_;
                          auVar90._8_4_ = fStack_3808 * auVar42._8_4_;
                          auVar90._12_4_ = fStack_3804 * auVar42._12_4_;
                          uVar38 = *(undefined4 *)(local_3700 + uVar25);
                          auVar105._4_4_ = uVar38;
                          auVar105._0_4_ = uVar38;
                          auVar105._8_4_ = uVar38;
                          auVar105._12_4_ = uVar38;
                          auVar42 = vsubps_avx(auVar105,auVar20);
                          auVar97._0_4_ = local_3800._0_4_ * auVar42._0_4_;
                          auVar97._4_4_ = local_3800._4_4_ * auVar42._4_4_;
                          auVar97._8_4_ = local_3800._8_4_ * auVar42._8_4_;
                          auVar97._12_4_ = local_3800._12_4_ * auVar42._12_4_;
                          auVar42 = vminps_avx(auVar75,auVar83);
                          auVar46 = vminps_avx(auVar110,auVar90);
                          auVar42 = vmaxps_avx(auVar42,auVar46);
                          auVar46 = vminps_avx(auVar117,auVar97);
                          auVar42 = vmaxps_avx(auVar42,auVar46);
                          auVar43 = vmulps_avx512vl(auVar42,auVar149._0_16_);
                          auVar42 = vmaxps_avx(auVar75,auVar83);
                          auVar46 = vmaxps_avx(auVar110,auVar90);
                          auVar46 = vminps_avx(auVar42,auVar46);
                          auVar42 = vmaxps_avx(auVar117,auVar97);
                          auVar42 = vminps_avx(auVar46,auVar42);
                          auVar46 = vmulps_avx512vl(auVar42,auVar150._0_16_);
                          auVar42 = vmaxps_avx(auVar43,local_37c0);
                          auVar46 = vminps_avx(auVar46,local_37b0);
                          uVar12 = vcmpps_avx512vl(auVar42,auVar46,2);
                          if ((bVar27 & (byte)uVar12) == 0) {
                            bVar39 = false;
                          }
                          else {
                            local_3898 = uVar30;
                            uVar36 = *(ushort *)(lVar26 + lVar28 * 8);
                            uVar4 = *(ushort *)(lVar26 + 2 + lVar28 * 8);
                            pGVar6 = (context->scene->geometries).items[*(uint *)(lVar26 + 0x88)].
                                     ptr;
                            lVar33 = *(long *)&pGVar6->field_0x58;
                            lVar7 = *(long *)&pGVar6[1].time_range.upper;
                            local_38e8 = (ulong)*(uint *)(lVar26 + 4 + lVar28 * 8) *
                                         pGVar6[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                            local_3954 = uVar36 & 0x7fff;
                            local_3958 = uVar4 & 0x7fff;
                            uVar5 = *(uint *)(lVar33 + 4 + local_38e8);
                            uVar30 = (ulong)uVar5;
                            uVar25 = (ulong)(uVar5 * local_3958 +
                                            *(int *)(lVar33 + local_38e8) + local_3954);
                            p_Var8 = pGVar6[1].intersectionFilterN;
                            puVar1 = (undefined8 *)(lVar7 + (uVar25 + 1) * (long)p_Var8);
                            local_3600._16_8_ = *puVar1;
                            local_3600._24_8_ = puVar1[1];
                            lVar26 = uVar25 + uVar30;
                            puVar1 = (undefined8 *)(lVar7 + lVar26 * (long)p_Var8);
                            local_35d0 = *puVar1;
                            uStack_35c8 = puVar1[1];
                            lVar34 = uVar25 + uVar30 + 1;
                            puVar1 = (undefined8 *)(lVar7 + lVar34 * (long)p_Var8);
                            local_35e0 = *puVar1;
                            uStack_35d8 = puVar1[1];
                            uVar32 = (ulong)(-1 < (short)uVar36);
                            puVar1 = (undefined8 *)(lVar7 + (uVar25 + uVar32 + 1) * (long)p_Var8);
                            lVar28 = uVar32 + lVar34;
                            puVar2 = (undefined8 *)(lVar7 + lVar28 * (long)p_Var8);
                            local_35a0 = *puVar2;
                            uStack_3598 = puVar2[1];
                            if ((short)uVar4 < 0) {
                              uVar30 = 0;
                            }
                            puVar2 = (undefined8 *)(lVar7 + (lVar26 + uVar30) * (long)p_Var8);
                            puVar3 = (undefined8 *)(lVar7 + (lVar34 + uVar30) * (long)p_Var8);
                            local_3560 = *puVar3;
                            uStack_3558 = puVar3[1];
                            puVar3 = (undefined8 *)(lVar7 + (uVar30 + lVar28) * (long)p_Var8);
                            local_36a0 = vpbroadcastd_avx512vl();
                            local_3600._0_16_ =
                                 *(undefined1 (*) [16])(lVar7 + (long)p_Var8 * uVar25);
                            local_35c0 = local_3600._16_8_;
                            uStack_35b8 = local_3600._24_8_;
                            local_35b0 = *puVar1;
                            uStack_35a8 = puVar1[1];
                            local_3590 = local_35e0;
                            uStack_3588 = uStack_35d8;
                            local_3580 = local_35d0;
                            uStack_3578 = uStack_35c8;
                            local_3570 = local_35e0;
                            uStack_3568 = uStack_35d8;
                            local_3550 = *puVar2;
                            uStack_3548 = puVar2[1];
                            local_3540 = local_35e0;
                            uStack_3538 = uStack_35d8;
                            local_3530 = local_35a0;
                            uStack_3528 = uStack_3598;
                            local_3520 = *puVar3;
                            uStack_3518 = puVar3[1];
                            local_3510 = local_3560;
                            uStack_3508 = uStack_3558;
                            local_36b0 = vpbroadcastd_avx512vl();
                            puVar29 = (uint *)&uStack_35c8;
                            uVar32 = 0;
                            ray = local_3968;
                            bVar23 = bVar27;
                            local_3960 = lVar33;
                            do {
                              uVar5 = puVar29[-0xe];
                              auVar76._4_4_ = uVar5;
                              auVar76._0_4_ = uVar5;
                              auVar76._8_4_ = uVar5;
                              auVar76._12_4_ = uVar5;
                              uVar5 = puVar29[-0xd];
                              auVar84._4_4_ = uVar5;
                              auVar84._0_4_ = uVar5;
                              auVar84._8_4_ = uVar5;
                              auVar84._12_4_ = uVar5;
                              uVar5 = puVar29[-0xc];
                              auVar91._4_4_ = uVar5;
                              auVar91._0_4_ = uVar5;
                              auVar91._8_4_ = uVar5;
                              auVar91._12_4_ = uVar5;
                              uVar5 = puVar29[-10];
                              local_3610._4_4_ = uVar5;
                              local_3610._0_4_ = uVar5;
                              local_3610._8_4_ = uVar5;
                              local_3610._12_4_ = uVar5;
                              uVar5 = puVar29[-9];
                              local_3620._4_4_ = uVar5;
                              local_3620._0_4_ = uVar5;
                              local_3620._8_4_ = uVar5;
                              local_3620._12_4_ = uVar5;
                              uVar5 = puVar29[-8];
                              local_3630._4_4_ = uVar5;
                              local_3630._0_4_ = uVar5;
                              local_3630._8_4_ = uVar5;
                              local_3630._12_4_ = uVar5;
                              uVar5 = puVar29[-2];
                              local_3640._4_4_ = uVar5;
                              local_3640._0_4_ = uVar5;
                              local_3640._8_4_ = uVar5;
                              local_3640._12_4_ = uVar5;
                              local_3650 = vbroadcastss_avx512vl(ZEXT416(puVar29[-1]));
                              local_3660 = vbroadcastss_avx512vl(ZEXT416(*puVar29));
                              local_36e0._0_16_ = local_36b0;
                              local_3700._0_16_ = local_36a0;
                              auVar42 = *(undefined1 (*) [16])ray;
                              auVar46 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar43 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar44 = *(undefined1 (*) [16])(ray + 0x40);
                              auVar45 = *(undefined1 (*) [16])(ray + 0x50);
                              auVar61 = *(undefined1 (*) [16])(ray + 0x60);
                              auVar81 = vsubps_avx(auVar76,auVar42);
                              auVar70 = vsubps_avx(auVar84,auVar46);
                              auVar82 = vsubps_avx(auVar91,auVar43);
                              auVar60 = vsubps_avx(local_3610,auVar42);
                              auVar47 = vsubps_avx512vl(local_3620,auVar46);
                              auVar48 = vsubps_avx512vl(local_3630,auVar43);
                              auVar49 = vsubps_avx512vl(local_3640,auVar42);
                              auVar50 = vsubps_avx512vl(local_3650,auVar46);
                              auVar51 = vsubps_avx512vl(local_3660,auVar43);
                              auVar52 = vsubps_avx512vl(auVar49,auVar81);
                              auVar53 = vsubps_avx512vl(auVar50,auVar70);
                              auVar42 = vsubps_avx(auVar51,auVar82);
                              auVar54 = vsubps_avx512vl(auVar81,auVar60);
                              auVar55 = vsubps_avx512vl(auVar70,auVar47);
                              auVar56 = vsubps_avx512vl(auVar82,auVar48);
                              auVar57 = vaddps_avx512vl(auVar49,auVar81);
                              auVar58 = vaddps_avx512vl(auVar50,auVar70);
                              auVar92._0_4_ = auVar82._0_4_ + auVar51._0_4_;
                              auVar92._4_4_ = auVar82._4_4_ + auVar51._4_4_;
                              auVar92._8_4_ = auVar82._8_4_ + auVar51._8_4_;
                              auVar92._12_4_ = auVar82._12_4_ + auVar51._12_4_;
                              auVar98._0_4_ = auVar42._0_4_ * auVar58._0_4_;
                              auVar98._4_4_ = auVar42._4_4_ * auVar58._4_4_;
                              auVar98._8_4_ = auVar42._8_4_ * auVar58._8_4_;
                              auVar98._12_4_ = auVar42._12_4_ * auVar58._12_4_;
                              auVar43 = vfmsub231ps_fma(auVar98,auVar53,auVar92);
                              auVar93._0_4_ = auVar52._0_4_ * auVar92._0_4_;
                              auVar93._4_4_ = auVar52._4_4_ * auVar92._4_4_;
                              auVar93._8_4_ = auVar52._8_4_ * auVar92._8_4_;
                              auVar93._12_4_ = auVar52._12_4_ * auVar92._12_4_;
                              auVar46 = vfmsub231ps_fma(auVar93,auVar42,auVar57);
                              auVar77._0_4_ = auVar53._0_4_ * auVar57._0_4_;
                              auVar77._4_4_ = auVar53._4_4_ * auVar57._4_4_;
                              auVar77._8_4_ = auVar53._8_4_ * auVar57._8_4_;
                              auVar77._12_4_ = auVar53._12_4_ * auVar57._12_4_;
                              auVar57 = vfmsub231ps_fma(auVar77,auVar52,auVar58);
                              fVar137 = auVar61._0_4_;
                              auVar78._0_4_ = fVar137 * auVar57._0_4_;
                              fVar131 = auVar61._4_4_;
                              auVar78._4_4_ = fVar131 * auVar57._4_4_;
                              fVar141 = auVar61._8_4_;
                              auVar78._8_4_ = fVar141 * auVar57._8_4_;
                              fVar143 = auVar61._12_4_;
                              auVar78._12_4_ = fVar143 * auVar57._12_4_;
                              auVar46 = vfmadd231ps_fma(auVar78,auVar45,auVar46);
                              auVar46 = vfmadd231ps_fma(auVar46,auVar44,auVar43);
                              auVar85._0_4_ = auVar81._0_4_ + auVar60._0_4_;
                              auVar85._4_4_ = auVar81._4_4_ + auVar60._4_4_;
                              auVar85._8_4_ = auVar81._8_4_ + auVar60._8_4_;
                              auVar85._12_4_ = auVar81._12_4_ + auVar60._12_4_;
                              auVar43 = vaddps_avx512vl(auVar70,auVar47);
                              auVar57 = vaddps_avx512vl(auVar82,auVar48);
                              auVar58 = vmulps_avx512vl(auVar43,auVar56);
                              auVar58 = vfmsub231ps_avx512vl(auVar58,auVar55,auVar57);
                              auVar57 = vmulps_avx512vl(auVar57,auVar54);
                              auVar57 = vfmsub231ps_avx512vl(auVar57,auVar56,auVar85);
                              auVar59 = vmulps_avx512vl(auVar85,auVar55);
                              auVar43 = vfmsub231ps_avx512vl(auVar59,auVar54,auVar43);
                              auVar59 = vsubps_avx512vl(auVar60,auVar49);
                              auVar99._0_4_ = fVar137 * auVar43._0_4_;
                              auVar99._4_4_ = fVar131 * auVar43._4_4_;
                              auVar99._8_4_ = fVar141 * auVar43._8_4_;
                              auVar99._12_4_ = fVar143 * auVar43._12_4_;
                              auVar43 = vfmadd231ps_avx512vl(auVar99,auVar45,auVar57);
                              auVar57 = vsubps_avx512vl(auVar47,auVar50);
                              auVar43 = vfmadd231ps_fma(auVar43,auVar44,auVar58);
                              auVar58 = vsubps_avx512vl(auVar48,auVar51);
                              auVar49 = vaddps_avx512vl(auVar60,auVar49);
                              auVar47 = vaddps_avx512vl(auVar47,auVar50);
                              auVar60 = vaddps_avx512vl(auVar48,auVar51);
                              auVar48 = vmulps_avx512vl(auVar47,auVar58);
                              auVar48 = vfmsub231ps_avx512vl(auVar48,auVar57,auVar60);
                              auVar111._0_4_ = auVar60._0_4_ * auVar59._0_4_;
                              auVar111._4_4_ = auVar60._4_4_ * auVar59._4_4_;
                              auVar111._8_4_ = auVar60._8_4_ * auVar59._8_4_;
                              auVar111._12_4_ = auVar60._12_4_ * auVar59._12_4_;
                              auVar60 = vfmsub231ps_fma(auVar111,auVar58,auVar49);
                              auVar115._0_4_ = auVar49._0_4_ * auVar57._0_4_;
                              auVar115._4_4_ = auVar49._4_4_ * auVar57._4_4_;
                              auVar115._8_4_ = auVar49._8_4_ * auVar57._8_4_;
                              auVar115._12_4_ = auVar49._12_4_ * auVar57._12_4_;
                              auVar47 = vfmsub231ps_avx512vl(auVar115,auVar59,auVar47);
                              auVar61 = vmulps_avx512vl(auVar47,auVar61);
                              auVar61 = vfmadd231ps_avx512vl(auVar61,auVar45,auVar60);
                              auVar61 = vfmadd231ps_avx512vl(auVar61,auVar44,auVar48);
                              fVar138 = auVar43._0_4_;
                              fVar41 = auVar46._0_4_;
                              auVar112._0_4_ = fVar41 + fVar138;
                              fVar132 = auVar43._4_4_;
                              fVar71 = auVar46._4_4_;
                              auVar112._4_4_ = fVar71 + fVar132;
                              fVar142 = auVar43._8_4_;
                              fVar72 = auVar46._8_4_;
                              auVar112._8_4_ = fVar72 + fVar142;
                              fVar144 = auVar43._12_4_;
                              fVar73 = auVar46._12_4_;
                              auVar112._12_4_ = fVar73 + fVar144;
                              auVar60 = vaddps_avx512vl(auVar61,auVar112);
                              auVar51 = auVar146._0_16_;
                              auVar47 = vandps_avx512vl(auVar60,auVar51);
                              auVar48 = vmulps_avx512vl(auVar47,auVar151._0_16_);
                              auVar49 = vminps_avx512vl(auVar46,auVar43);
                              auVar49 = vminps_avx512vl(auVar49,auVar61);
                              auVar50 = vxorps_avx512vl(auVar48,auVar145._0_16_);
                              uVar12 = vcmpps_avx512vl(auVar49,auVar50,5);
                              auVar46 = vmaxps_avx512vl(auVar46,auVar43);
                              auVar46 = vmaxps_avx512vl(auVar46,auVar61);
                              local_3670 = vbroadcastss_avx512vl(ZEXT416(puVar29[-6]));
                              uVar13 = vcmpps_avx512vl(auVar46,auVar48,2);
                              local_3680 = vbroadcastss_avx512vl(ZEXT416(puVar29[-5]));
                              local_3690 = vbroadcastss_avx512vl(ZEXT416(puVar29[-4]));
                              bVar37 = ((byte)uVar12 | (byte)uVar13) & 0xf & bVar23;
                              bVar21 = bVar23;
                              if (bVar37 != 0) {
                                auVar46 = vmulps_avx512vl(auVar55,auVar42);
                                auVar43 = vmulps_avx512vl(auVar52,auVar56);
                                auVar61 = vmulps_avx512vl(auVar54,auVar53);
                                auVar48 = vmulps_avx512vl(auVar57,auVar56);
                                auVar49 = vmulps_avx512vl(auVar54,auVar58);
                                auVar50 = vmulps_avx512vl(auVar59,auVar55);
                                auVar53 = vfmsub213ps_avx512vl(auVar53,auVar56,auVar46);
                                auVar42 = vfmsub213ps_avx512vl(auVar42,auVar54,auVar43);
                                auVar52 = vfmsub213ps_avx512vl(auVar52,auVar55,auVar61);
                                auVar58 = vfmsub213ps_avx512vl(auVar58,auVar55,auVar48);
                                auVar56 = vfmsub213ps_avx512vl(auVar59,auVar56,auVar49);
                                auVar57 = vfmsub213ps_avx512vl(auVar57,auVar54,auVar50);
                                auVar46 = vandps_avx512vl(auVar46,auVar51);
                                auVar48 = vandps_avx512vl(auVar48,auVar51);
                                uVar30 = vcmpps_avx512vl(auVar46,auVar48,1);
                                auVar46 = vandps_avx512vl(auVar43,auVar51);
                                auVar43 = vandps_avx512vl(auVar49,auVar51);
                                uVar25 = vcmpps_avx512vl(auVar46,auVar43,1);
                                auVar46 = vandps_avx512vl(auVar61,auVar51);
                                auVar43 = vandps_avx512vl(auVar50,auVar51);
                                uVar14 = vcmpps_avx512vl(auVar46,auVar43,1);
                                bVar39 = (bool)((byte)uVar30 & 1);
                                auVar62._0_4_ =
                                     (uint)bVar39 * auVar53._0_4_ | (uint)!bVar39 * auVar58._0_4_;
                                bVar39 = (bool)((byte)(uVar30 >> 1) & 1);
                                auVar62._4_4_ =
                                     (uint)bVar39 * auVar53._4_4_ | (uint)!bVar39 * auVar58._4_4_;
                                bVar39 = (bool)((byte)(uVar30 >> 2) & 1);
                                auVar62._8_4_ =
                                     (uint)bVar39 * auVar53._8_4_ | (uint)!bVar39 * auVar58._8_4_;
                                bVar39 = (bool)((byte)(uVar30 >> 3) & 1);
                                auVar62._12_4_ =
                                     (uint)bVar39 * auVar53._12_4_ | (uint)!bVar39 * auVar58._12_4_;
                                bVar39 = (bool)((byte)uVar25 & 1);
                                auVar63._0_4_ =
                                     (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * auVar56._0_4_;
                                bVar39 = (bool)((byte)(uVar25 >> 1) & 1);
                                auVar63._4_4_ =
                                     (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * auVar56._4_4_;
                                bVar39 = (bool)((byte)(uVar25 >> 2) & 1);
                                auVar63._8_4_ =
                                     (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * auVar56._8_4_;
                                bVar39 = (bool)((byte)(uVar25 >> 3) & 1);
                                auVar63._12_4_ =
                                     (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * auVar56._12_4_;
                                bVar39 = (bool)((byte)uVar14 & 1);
                                auVar64._0_4_ =
                                     (float)((uint)bVar39 * auVar52._0_4_ |
                                            (uint)!bVar39 * auVar57._0_4_);
                                bVar39 = (bool)((byte)(uVar14 >> 1) & 1);
                                auVar64._4_4_ =
                                     (float)((uint)bVar39 * auVar52._4_4_ |
                                            (uint)!bVar39 * auVar57._4_4_);
                                bVar39 = (bool)((byte)(uVar14 >> 2) & 1);
                                auVar64._8_4_ =
                                     (float)((uint)bVar39 * auVar52._8_4_ |
                                            (uint)!bVar39 * auVar57._8_4_);
                                bVar39 = (bool)((byte)(uVar14 >> 3) & 1);
                                auVar64._12_4_ =
                                     (float)((uint)bVar39 * auVar52._12_4_ |
                                            (uint)!bVar39 * auVar57._12_4_);
                                auVar139._0_4_ = fVar137 * auVar64._0_4_;
                                auVar139._4_4_ = fVar131 * auVar64._4_4_;
                                auVar139._8_4_ = fVar141 * auVar64._8_4_;
                                auVar139._12_4_ = fVar143 * auVar64._12_4_;
                                auVar42 = vfmadd213ps_fma(auVar45,auVar63,auVar139);
                                auVar42 = vfmadd213ps_fma(auVar44,auVar62,auVar42);
                                auVar127._0_4_ = auVar42._0_4_ + auVar42._0_4_;
                                auVar127._4_4_ = auVar42._4_4_ + auVar42._4_4_;
                                auVar127._8_4_ = auVar42._8_4_ + auVar42._8_4_;
                                auVar127._12_4_ = auVar42._12_4_ + auVar42._12_4_;
                                auVar133._0_4_ = auVar82._0_4_ * auVar64._0_4_;
                                auVar133._4_4_ = auVar82._4_4_ * auVar64._4_4_;
                                auVar133._8_4_ = auVar82._8_4_ * auVar64._8_4_;
                                auVar133._12_4_ = auVar82._12_4_ * auVar64._12_4_;
                                auVar42 = vfmadd213ps_fma(auVar70,auVar63,auVar133);
                                auVar46 = vfmadd213ps_fma(auVar81,auVar62,auVar42);
                                auVar42 = vrcp14ps_avx512vl(auVar127);
                                auVar43 = vxorps_avx512vl(auVar127,auVar145._0_16_);
                                auVar45 = auVar147._0_16_;
                                auVar44 = vfnmadd213ps_avx512vl(auVar42,auVar127,auVar45);
                                auVar42 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
                                auVar118._0_4_ = auVar42._0_4_ * (auVar46._0_4_ + auVar46._0_4_);
                                auVar118._4_4_ = auVar42._4_4_ * (auVar46._4_4_ + auVar46._4_4_);
                                auVar118._8_4_ = auVar42._8_4_ * (auVar46._8_4_ + auVar46._8_4_);
                                auVar118._12_4_ = auVar42._12_4_ * (auVar46._12_4_ + auVar46._12_4_)
                                ;
                                uVar12 = vcmpps_avx512vl(auVar118,*(undefined1 (*) [16])(ray + 0x80)
                                                         ,2);
                                uVar13 = vcmpps_avx512vl(auVar118,*(undefined1 (*) [16])(ray + 0x30)
                                                         ,0xd);
                                uVar15 = vcmpps_avx512vl(auVar127,auVar43,4);
                                bVar37 = bVar37 & (byte)uVar12 & (byte)uVar13 & (byte)uVar15;
                                if (bVar37 != 0) {
                                  pGVar6 = (context->scene->geometries).items
                                           [*(uint *)(local_36e0 + uVar32 * 4)].ptr;
                                  uVar5 = pGVar6->mask;
                                  auVar120._4_4_ = uVar5;
                                  auVar120._0_4_ = uVar5;
                                  auVar120._8_4_ = uVar5;
                                  auVar120._12_4_ = uVar5;
                                  uVar12 = vptestmd_avx512vl(auVar120,*(undefined1 (*) [16])
                                                                       (ray + 0x90));
                                  bVar21 = (byte)uVar12 & 0xf & bVar37;
                                  bVar22 = bVar23;
                                  if (bVar21 != 0) {
                                    local_3950._0_8_ = uVar32;
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar42 = vcvtsi2ss_avx512f(auVar55,*(ushort *)
                                                                           (lVar33 + 8 + local_38e8)
                                                                          - 1);
                                      auVar46 = vcvtsi2ss_avx512f(auVar55,*(ushort *)
                                                                           (lVar33 + 10 + local_38e8
                                                                           ) - 1);
                                      auVar43 = vcvtsi2ss_avx512f(auVar55,((uint)uVar32 & 1) +
                                                                          local_3954);
                                      auVar44 = vcvtsi2ss_avx512f(auVar55,((uint)(uVar32 >> 1) &
                                                                          0x7fffffff) + local_3958);
                                      local_3740 = vpbroadcastd_avx512vl();
                                      auVar18._12_4_ = 0;
                                      auVar18._0_12_ = ZEXT812(0);
                                      auVar61 = vrcp14ss_avx512f(auVar18 << 0x20,
                                                                 ZEXT416(auVar42._0_4_));
                                      auVar42 = vfnmadd213ss_fma(auVar42,auVar61,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar137 = auVar61._0_4_ * auVar42._0_4_;
                                      fVar131 = auVar43._0_4_;
                                      auVar135._0_4_ = fVar131 * auVar60._0_4_ + fVar41;
                                      auVar135._4_4_ = fVar131 * auVar60._4_4_ + fVar71;
                                      auVar135._8_4_ = fVar131 * auVar60._8_4_ + fVar72;
                                      auVar135._12_4_ = fVar131 * auVar60._12_4_ + fVar73;
                                      auVar122._4_4_ = fVar137;
                                      auVar122._0_4_ = fVar137;
                                      auVar122._8_4_ = fVar137;
                                      auVar122._12_4_ = fVar137;
                                      auVar43 = vmulps_avx512vl(auVar135,auVar122);
                                      bVar39 = (bool)(bVar37 >> 1 & 1);
                                      bVar10 = (bool)(bVar37 >> 2 & 1);
                                      auVar61 = vrcp14ss_avx512f(auVar18 << 0x20,
                                                                 ZEXT416(auVar46._0_4_));
                                      auVar42 = vfnmadd213ss_fma(auVar46,auVar61,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar137 = auVar61._0_4_ * auVar42._0_4_;
                                      fVar131 = auVar44._0_4_;
                                      auVar129._0_4_ = fVar131 * auVar60._0_4_ + fVar138;
                                      auVar129._4_4_ = fVar131 * auVar60._4_4_ + fVar132;
                                      auVar129._8_4_ = fVar131 * auVar60._8_4_ + fVar142;
                                      auVar129._12_4_ = fVar131 * auVar60._12_4_ + fVar144;
                                      auVar123._4_4_ = fVar137;
                                      auVar123._0_4_ = fVar137;
                                      auVar123._8_4_ = fVar137;
                                      auVar123._12_4_ = fVar137;
                                      auVar42 = vmulps_avx512vl(auVar129,auVar123);
                                      bVar9 = (bool)(bVar37 >> 1 & 1);
                                      bVar11 = (bool)(bVar37 >> 2 & 1);
                                      auVar17._8_4_ = 0x219392ef;
                                      auVar17._0_8_ = 0x219392ef219392ef;
                                      auVar17._12_4_ = 0x219392ef;
                                      uVar30 = vcmpps_avx512vl(auVar47,auVar17,5);
                                      auVar46 = vrcp14ps_avx512vl(auVar60);
                                      auVar44 = vfnmadd213ps_avx512vl(auVar60,auVar46,auVar45);
                                      auVar46 = vfmadd132ps_avx512vl(auVar44,auVar46,auVar46);
                                      fVar143 = (float)((uint)((byte)uVar30 & 1) * auVar46._0_4_);
                                      fVar137 = (float)((uint)((byte)(uVar30 >> 1) & 1) *
                                                       auVar46._4_4_);
                                      fVar131 = (float)((uint)((byte)(uVar30 >> 2) & 1) *
                                                       auVar46._8_4_);
                                      fVar141 = (float)((uint)((byte)(uVar30 >> 3) & 1) *
                                                       auVar46._12_4_);
                                      auVar79._0_4_ =
                                           (float)((uint)(bVar37 & 1) * auVar43._0_4_ |
                                                  (uint)!(bool)(bVar37 & 1) * (int)fVar41) * fVar143
                                      ;
                                      auVar79._4_4_ =
                                           (float)((uint)bVar39 * auVar43._4_4_ |
                                                  (uint)!bVar39 * (int)fVar71) * fVar137;
                                      auVar79._8_4_ =
                                           (float)((uint)bVar10 * auVar43._8_4_ |
                                                  (uint)!bVar10 * (int)fVar72) * fVar131;
                                      auVar79._12_4_ =
                                           (float)((uint)(bVar37 >> 3) * auVar43._12_4_ |
                                                  (uint)!(bool)(bVar37 >> 3) * (int)fVar73) *
                                           fVar141;
                                      local_3770 = vminps_avx512vl(auVar79,auVar45);
                                      auVar102._0_4_ =
                                           (float)((uint)(bVar37 & 1) * auVar42._0_4_ |
                                                  (uint)!(bool)(bVar37 & 1) * (int)fVar138) *
                                           fVar143;
                                      auVar102._4_4_ =
                                           (float)((uint)bVar9 * auVar42._4_4_ |
                                                  (uint)!bVar9 * (int)fVar132) * fVar137;
                                      auVar102._8_4_ =
                                           (float)((uint)bVar11 * auVar42._8_4_ |
                                                  (uint)!bVar11 * (int)fVar142) * fVar131;
                                      auVar102._12_4_ =
                                           (float)((uint)(bVar37 >> 3) * auVar42._12_4_ |
                                                  (uint)!(bool)(bVar37 >> 3) * (int)fVar144) *
                                           fVar141;
                                      local_3760 = vminps_avx512vl(auVar102,auVar45);
                                      local_3750 = vpbroadcastd_avx512vl();
                                      auStack_3790 = auVar63;
                                      local_37a0 = (RTCHitN  [16])auVar62;
                                      _local_3780 = auVar64;
                                      vpcmpeqd_avx2(ZEXT1632(local_3770),ZEXT1632(local_3770));
                                      uStack_372c = context->user->instID[0];
                                      local_3730 = uStack_372c;
                                      uStack_3728 = uStack_372c;
                                      uStack_3724 = uStack_372c;
                                      uStack_3720 = context->user->instPrimID[0];
                                      uStack_371c = uStack_3720;
                                      uStack_3718 = uStack_3720;
                                      uStack_3714 = uStack_3720;
                                      local_3890 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar42 = vblendmps_avx512vl(local_3890,auVar118);
                                      bVar39 = (bool)(bVar21 >> 1 & 1);
                                      bVar9 = (bool)(bVar21 >> 2 & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)(bVar21 & 1) * auVar42._0_4_ |
                                           !(bool)(bVar21 & 1) * uStack_3720;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar39 * auVar42._4_4_ | !bVar39 * uStack_3720;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar9 * auVar42._8_4_ | !bVar9 * uStack_3720;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)(bVar21 >> 3) * auVar42._12_4_ |
                                           !(bool)(bVar21 >> 3) * uStack_3720;
                                      auVar42 = vpmovm2d_avx512vl((ulong)bVar21);
                                      local_38e0._0_16_ = auVar42;
                                      local_3920.geometryUserPtr = pGVar6->userPtr;
                                      local_3920.valid = (int *)local_38e0;
                                      local_3920.context = context->user;
                                      local_3920.ray = (RTCRayN *)ray;
                                      local_3920.hit = local_37a0;
                                      local_3920.N = 4;
                                      if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar6->occlusionFilterN)(&local_3920);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar145 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar151 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar150 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar149 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar148 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar147 = ZEXT1664(auVar42);
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar146 = ZEXT1664(auVar42);
                                        uVar32 = local_3950._0_8_;
                                        lVar33 = local_3960;
                                        ray = local_3968;
                                        auVar42 = local_38e0._0_16_;
                                      }
                                      uVar30 = vptestmd_avx512vl(auVar42,auVar42);
                                      if ((uVar30 & 0xf) == 0) {
                                        uVar30 = 0;
                                      }
                                      else {
                                        p_Var8 = context->args->filter;
                                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var8)(&local_3920);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar145 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar151 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar150 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar149 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar148 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar147 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar146 = ZEXT1664(auVar42);
                                          uVar32 = local_3950._0_8_;
                                          ray = local_3968;
                                          auVar42 = local_38e0._0_16_;
                                        }
                                        uVar30 = vptestmd_avx512vl(auVar42,auVar42);
                                        uVar30 = uVar30 & 0xf;
                                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar39 = (bool)((byte)uVar30 & 1);
                                        bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                                        bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
                                        bVar11 = SUB81(uVar30 >> 3,0);
                                        *(uint *)(local_3920.ray + 0x80) =
                                             (uint)bVar39 * auVar42._0_4_ |
                                             (uint)!bVar39 * *(int *)(local_3920.ray + 0x80);
                                        *(uint *)(local_3920.ray + 0x84) =
                                             (uint)bVar9 * auVar42._4_4_ |
                                             (uint)!bVar9 * *(int *)(local_3920.ray + 0x84);
                                        *(uint *)(local_3920.ray + 0x88) =
                                             (uint)bVar10 * auVar42._8_4_ |
                                             (uint)!bVar10 * *(int *)(local_3920.ray + 0x88);
                                        *(uint *)(local_3920.ray + 0x8c) =
                                             (uint)bVar11 * auVar42._12_4_ |
                                             (uint)!bVar11 * *(int *)(local_3920.ray + 0x8c);
                                      }
                                      bVar21 = (byte)uVar30;
                                      bVar39 = (bool)((byte)(uVar30 >> 1) & 1);
                                      bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
                                      bVar10 = SUB81(uVar30 >> 3,0);
                                      *(uint *)local_3938 =
                                           (uint)(bVar21 & 1) * *(int *)local_3938 |
                                           (uint)!(bool)(bVar21 & 1) * local_3890._0_4_;
                                      *(uint *)(local_3938 + 4) =
                                           (uint)bVar39 * *(int *)(local_3938 + 4) |
                                           (uint)!bVar39 * local_3890._4_4_;
                                      *(uint *)(local_3938 + 8) =
                                           (uint)bVar9 * *(int *)(local_3938 + 8) |
                                           (uint)!bVar9 * local_3890._8_4_;
                                      *(uint *)(local_3938 + 0xc) =
                                           (uint)bVar10 * *(int *)(local_3938 + 0xc) |
                                           (uint)!bVar10 * local_3890._12_4_;
                                    }
                                    bVar22 = (bVar21 ^ 0xf) & bVar23;
                                  }
                                  bVar21 = (bVar37 ^ 0xf) & bVar23;
                                  bVar23 = bVar22;
                                }
                              }
                              if (bVar21 != 0) {
                                auVar42 = *(undefined1 (*) [16])ray;
                                auVar46 = *(undefined1 (*) [16])(ray + 0x10);
                                auVar43 = *(undefined1 (*) [16])(ray + 0x20);
                                auVar44 = *(undefined1 (*) [16])(ray + 0x40);
                                auVar45 = *(undefined1 (*) [16])(ray + 0x50);
                                auVar61 = *(undefined1 (*) [16])(ray + 0x60);
                                auVar81 = vsubps_avx(local_3670,auVar42);
                                auVar70 = vsubps_avx(local_3680,auVar46);
                                auVar82 = vsubps_avx(local_3690,auVar43);
                                auVar60 = vsubps_avx(local_3640,auVar42);
                                auVar57 = vsubps_avx(local_3650,auVar46);
                                auVar47 = vsubps_avx512vl(local_3660,auVar43);
                                auVar48 = vsubps_avx512vl(local_3610,auVar42);
                                auVar46 = vsubps_avx512vl(local_3620,auVar46);
                                auVar43 = vsubps_avx512vl(local_3630,auVar43);
                                auVar49 = vsubps_avx512vl(auVar48,auVar81);
                                auVar50 = vsubps_avx512vl(auVar46,auVar70);
                                auVar51 = vsubps_avx512vl(auVar43,auVar82);
                                auVar52 = vsubps_avx512vl(auVar81,auVar60);
                                auVar53 = vsubps_avx512vl(auVar70,auVar57);
                                auVar54 = vsubps_avx512vl(auVar82,auVar47);
                                auVar55 = vsubps_avx512vl(auVar60,auVar48);
                                auVar56 = vsubps_avx512vl(auVar57,auVar46);
                                auVar58 = vsubps_avx512vl(auVar47,auVar43);
                                auVar42 = vaddps_avx512vl(auVar48,auVar81);
                                auVar59 = vaddps_avx512vl(auVar46,auVar70);
                                auVar65 = vaddps_avx512vl(auVar43,auVar82);
                                auVar66 = vmulps_avx512vl(auVar59,auVar51);
                                auVar66 = vfmsub231ps_avx512vl(auVar66,auVar50,auVar65);
                                auVar65 = vmulps_avx512vl(auVar65,auVar49);
                                auVar65 = vfmsub231ps_avx512vl(auVar65,auVar51,auVar42);
                                auVar100._0_4_ = auVar50._0_4_ * auVar42._0_4_;
                                auVar100._4_4_ = auVar50._4_4_ * auVar42._4_4_;
                                auVar100._8_4_ = auVar50._8_4_ * auVar42._8_4_;
                                auVar100._12_4_ = auVar50._12_4_ * auVar42._12_4_;
                                auVar42 = vfmsub231ps_fma(auVar100,auVar49,auVar59);
                                fVar138 = auVar61._0_4_;
                                auVar101._0_4_ = fVar138 * auVar42._0_4_;
                                fVar132 = auVar61._4_4_;
                                auVar101._4_4_ = fVar132 * auVar42._4_4_;
                                fVar142 = auVar61._8_4_;
                                auVar101._8_4_ = fVar142 * auVar42._8_4_;
                                fVar144 = auVar61._12_4_;
                                auVar101._12_4_ = fVar144 * auVar42._12_4_;
                                auVar42 = vfmadd231ps_avx512vl(auVar101,auVar45,auVar65);
                                auVar59 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar66);
                                auVar106._0_4_ = auVar81._0_4_ + auVar60._0_4_;
                                auVar106._4_4_ = auVar81._4_4_ + auVar60._4_4_;
                                auVar106._8_4_ = auVar81._8_4_ + auVar60._8_4_;
                                auVar106._12_4_ = auVar81._12_4_ + auVar60._12_4_;
                                auVar42 = vaddps_avx512vl(auVar70,auVar57);
                                auVar65 = vaddps_avx512vl(auVar82,auVar47);
                                auVar66 = vmulps_avx512vl(auVar42,auVar54);
                                auVar66 = vfmsub231ps_avx512vl(auVar66,auVar53,auVar65);
                                auVar65 = vmulps_avx512vl(auVar65,auVar52);
                                auVar65 = vfmsub231ps_avx512vl(auVar65,auVar54,auVar106);
                                auVar67 = vmulps_avx512vl(auVar106,auVar53);
                                auVar42 = vfmsub231ps_avx512vl(auVar67,auVar52,auVar42);
                                auVar107._0_4_ = fVar138 * auVar42._0_4_;
                                auVar107._4_4_ = fVar132 * auVar42._4_4_;
                                auVar107._8_4_ = fVar142 * auVar42._8_4_;
                                auVar107._12_4_ = fVar144 * auVar42._12_4_;
                                auVar42 = vfmadd231ps_avx512vl(auVar107,auVar45,auVar65);
                                auVar65 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar66);
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar145 = ZEXT1664(auVar66);
                                auVar42 = vaddps_avx512vl(auVar60,auVar48);
                                auVar46 = vaddps_avx512vl(auVar57,auVar46);
                                auVar43 = vaddps_avx512vl(auVar47,auVar43);
                                auVar60 = vmulps_avx512vl(auVar46,auVar58);
                                auVar60 = vfmsub231ps_avx512vl(auVar60,auVar56,auVar43);
                                auVar43 = vmulps_avx512vl(auVar43,auVar55);
                                auVar43 = vfmsub231ps_avx512vl(auVar43,auVar58,auVar42);
                                auVar113._0_4_ = auVar42._0_4_ * auVar56._0_4_;
                                auVar113._4_4_ = auVar42._4_4_ * auVar56._4_4_;
                                auVar113._8_4_ = auVar42._8_4_ * auVar56._8_4_;
                                auVar113._12_4_ = auVar42._12_4_ * auVar56._12_4_;
                                auVar42 = vfmsub231ps_fma(auVar113,auVar55,auVar46);
                                auVar42 = vmulps_avx512vl(auVar42,auVar61);
                                auVar42 = vfmadd231ps_avx512vl(auVar42,auVar45,auVar43);
                                auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar60);
                                auVar114._0_4_ = auVar59._0_4_ + auVar65._0_4_;
                                auVar114._4_4_ = auVar59._4_4_ + auVar65._4_4_;
                                auVar114._8_4_ = auVar59._8_4_ + auVar65._8_4_;
                                auVar114._12_4_ = auVar59._12_4_ + auVar65._12_4_;
                                auVar46 = vaddps_avx512vl(auVar42,auVar114);
                                auVar47 = auVar146._0_16_;
                                auVar43 = vandps_avx512vl(auVar46,auVar47);
                                auVar61 = vmulps_avx512vl(auVar43,auVar151._0_16_);
                                auVar60 = vminps_avx512vl(auVar59,auVar65);
                                auVar60 = vminps_avx512vl(auVar60,auVar42);
                                auVar57 = vxorps_avx512vl(auVar61,auVar66);
                                uVar12 = vcmpps_avx512vl(auVar60,auVar57,5);
                                auVar60 = vmaxps_avx512vl(auVar59,auVar65);
                                auVar42 = vmaxps_avx512vl(auVar60,auVar42);
                                uVar13 = vcmpps_avx512vl(auVar42,auVar61,2);
                                bVar21 = ((byte)uVar12 | (byte)uVar13) & 0xf & bVar23;
                                if (bVar21 != 0) {
                                  auVar42 = vmulps_avx512vl(auVar53,auVar51);
                                  auVar61 = vmulps_avx512vl(auVar49,auVar54);
                                  auVar60 = vmulps_avx512vl(auVar52,auVar50);
                                  auVar57 = vmulps_avx512vl(auVar56,auVar54);
                                  auVar48 = vmulps_avx512vl(auVar52,auVar58);
                                  auVar67 = vmulps_avx512vl(auVar55,auVar53);
                                  auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar42);
                                  auVar51 = vfmsub213ps_avx512vl(auVar51,auVar52,auVar61);
                                  auVar49 = vfmsub213ps_avx512vl(auVar49,auVar53,auVar60);
                                  auVar58 = vfmsub213ps_avx512vl(auVar58,auVar53,auVar57);
                                  auVar54 = vfmsub213ps_avx512vl(auVar55,auVar54,auVar48);
                                  auVar52 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar67);
                                  auVar42 = vandps_avx512vl(auVar42,auVar47);
                                  auVar57 = vandps_avx512vl(auVar57,auVar47);
                                  uVar30 = vcmpps_avx512vl(auVar42,auVar57,1);
                                  auVar42 = vandps_avx512vl(auVar61,auVar47);
                                  auVar61 = vandps_avx512vl(auVar48,auVar47);
                                  uVar25 = vcmpps_avx512vl(auVar42,auVar61,1);
                                  auVar42 = vandps_avx512vl(auVar60,auVar47);
                                  auVar61 = vandps_avx512vl(auVar67,auVar47);
                                  uVar14 = vcmpps_avx512vl(auVar42,auVar61,1);
                                  bVar39 = (bool)((byte)uVar30 & 1);
                                  auVar68._0_4_ =
                                       (uint)bVar39 * auVar50._0_4_ | (uint)!bVar39 * auVar58._0_4_;
                                  bVar39 = (bool)((byte)(uVar30 >> 1) & 1);
                                  auVar68._4_4_ =
                                       (uint)bVar39 * auVar50._4_4_ | (uint)!bVar39 * auVar58._4_4_;
                                  bVar39 = (bool)((byte)(uVar30 >> 2) & 1);
                                  auVar68._8_4_ =
                                       (uint)bVar39 * auVar50._8_4_ | (uint)!bVar39 * auVar58._8_4_;
                                  bVar39 = (bool)((byte)(uVar30 >> 3) & 1);
                                  auVar68._12_4_ =
                                       (uint)bVar39 * auVar50._12_4_ |
                                       (uint)!bVar39 * auVar58._12_4_;
                                  bVar39 = (bool)((byte)uVar25 & 1);
                                  auVar69._0_4_ =
                                       (uint)bVar39 * auVar51._0_4_ | (uint)!bVar39 * auVar54._0_4_;
                                  bVar39 = (bool)((byte)(uVar25 >> 1) & 1);
                                  auVar69._4_4_ =
                                       (uint)bVar39 * auVar51._4_4_ | (uint)!bVar39 * auVar54._4_4_;
                                  bVar39 = (bool)((byte)(uVar25 >> 2) & 1);
                                  auVar69._8_4_ =
                                       (uint)bVar39 * auVar51._8_4_ | (uint)!bVar39 * auVar54._8_4_;
                                  bVar39 = (bool)((byte)(uVar25 >> 3) & 1);
                                  auVar69._12_4_ =
                                       (uint)bVar39 * auVar51._12_4_ |
                                       (uint)!bVar39 * auVar54._12_4_;
                                  bVar39 = (bool)((byte)uVar14 & 1);
                                  fVar41 = (float)((uint)bVar39 * auVar49._0_4_ |
                                                  (uint)!bVar39 * auVar52._0_4_);
                                  bVar39 = (bool)((byte)(uVar14 >> 1) & 1);
                                  fVar71 = (float)((uint)bVar39 * auVar49._4_4_ |
                                                  (uint)!bVar39 * auVar52._4_4_);
                                  bVar39 = (bool)((byte)(uVar14 >> 2) & 1);
                                  fVar72 = (float)((uint)bVar39 * auVar49._8_4_ |
                                                  (uint)!bVar39 * auVar52._8_4_);
                                  bVar39 = (bool)((byte)(uVar14 >> 3) & 1);
                                  fVar73 = (float)((uint)bVar39 * auVar49._12_4_ |
                                                  (uint)!bVar39 * auVar52._12_4_);
                                  auVar140._0_4_ = fVar138 * fVar41;
                                  auVar140._4_4_ = fVar132 * fVar71;
                                  auVar140._8_4_ = fVar142 * fVar72;
                                  auVar140._12_4_ = fVar144 * fVar73;
                                  auVar42 = vfmadd213ps_fma(auVar45,auVar69,auVar140);
                                  auVar42 = vfmadd213ps_fma(auVar44,auVar68,auVar42);
                                  auVar128._0_4_ = auVar42._0_4_ + auVar42._0_4_;
                                  auVar128._4_4_ = auVar42._4_4_ + auVar42._4_4_;
                                  auVar128._8_4_ = auVar42._8_4_ + auVar42._8_4_;
                                  auVar128._12_4_ = auVar42._12_4_ + auVar42._12_4_;
                                  auVar134._0_4_ = auVar82._0_4_ * fVar41;
                                  auVar134._4_4_ = auVar82._4_4_ * fVar71;
                                  auVar134._8_4_ = auVar82._8_4_ * fVar72;
                                  auVar134._12_4_ = auVar82._12_4_ * fVar73;
                                  auVar42 = vfmadd213ps_fma(auVar70,auVar69,auVar134);
                                  auVar44 = vfmadd213ps_fma(auVar81,auVar68,auVar42);
                                  auVar42 = vrcp14ps_avx512vl(auVar128);
                                  auVar45 = vxorps_avx512vl(auVar128,auVar66);
                                  auVar81 = auVar147._0_16_;
                                  auVar61 = vfnmadd213ps_avx512vl(auVar42,auVar128,auVar81);
                                  auVar42 = vfmadd132ps_fma(auVar61,auVar42,auVar42);
                                  auVar119._0_4_ = auVar42._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
                                  auVar119._4_4_ = auVar42._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
                                  auVar119._8_4_ = auVar42._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
                                  auVar119._12_4_ =
                                       auVar42._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
                                  uVar12 = vcmpps_avx512vl(auVar119,*(undefined1 (*) [16])
                                                                     (ray + 0x80),2);
                                  uVar13 = vcmpps_avx512vl(auVar119,*(undefined1 (*) [16])
                                                                     (ray + 0x30),0xd);
                                  uVar15 = vcmpps_avx512vl(auVar128,auVar45,4);
                                  bVar21 = bVar21 & (byte)uVar12 & (byte)uVar13 & (byte)uVar15;
                                  if (bVar21 != 0) {
                                    pGVar6 = (context->scene->geometries).items
                                             [*(uint *)(local_36e0 + uVar32 * 4)].ptr;
                                    uVar5 = pGVar6->mask;
                                    auVar121._4_4_ = uVar5;
                                    auVar121._0_4_ = uVar5;
                                    auVar121._8_4_ = uVar5;
                                    auVar121._12_4_ = uVar5;
                                    uVar12 = vptestmd_avx512vl(auVar121,*(undefined1 (*) [16])
                                                                         (ray + 0x90));
                                    bVar37 = (byte)uVar12 & 0xf & bVar21;
                                    if (bVar37 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar42 = vcvtsi2ss_avx512f(auVar47,*(ushort *)
                                                                             (lVar33 + 8 +
                                                                             local_38e8) - 1);
                                        auVar44 = vcvtsi2ss_avx512f(auVar47,*(ushort *)
                                                                             (lVar33 + 10 +
                                                                             local_38e8) - 1);
                                        auVar45 = vcvtsi2ss_avx512f(auVar53,((uint)uVar32 & 1) +
                                                                            local_3954);
                                        auVar61 = vcvtsi2ss_avx512f(auVar53,((uint)(uVar32 >> 1) &
                                                                            0x7fffffff) + local_3958
                                                                   );
                                        local_3740 = vpbroadcastd_avx512vl();
                                        auVar19._12_4_ = 0;
                                        auVar19._0_12_ = ZEXT812(0);
                                        auVar70 = vrcp14ss_avx512f(auVar19 << 0x20,
                                                                   ZEXT416(auVar42._0_4_));
                                        auVar42 = vfnmadd213ss_fma(auVar42,auVar70,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar138 = auVar70._0_4_ * auVar42._0_4_;
                                        auVar42 = vsubps_avx(auVar46,auVar59);
                                        fVar132 = auVar45._0_4_;
                                        auVar136._0_4_ = fVar132 * auVar46._0_4_ + auVar42._0_4_;
                                        auVar136._4_4_ = fVar132 * auVar46._4_4_ + auVar42._4_4_;
                                        auVar136._8_4_ = fVar132 * auVar46._8_4_ + auVar42._8_4_;
                                        auVar136._12_4_ = fVar132 * auVar46._12_4_ + auVar42._12_4_;
                                        auVar124._4_4_ = fVar138;
                                        auVar124._0_4_ = fVar138;
                                        auVar124._8_4_ = fVar138;
                                        auVar124._12_4_ = fVar138;
                                        auVar45 = vmulps_avx512vl(auVar136,auVar124);
                                        bVar39 = (bool)(bVar21 >> 1 & 1);
                                        bVar10 = (bool)(bVar21 >> 2 & 1);
                                        auVar70 = vrcp14ss_avx512f(auVar19 << 0x20,
                                                                   ZEXT416(auVar44._0_4_));
                                        auVar44 = vfnmadd213ss_fma(auVar44,auVar70,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar138 = auVar70._0_4_ * auVar44._0_4_;
                                        auVar44 = vsubps_avx(auVar46,auVar65);
                                        fVar132 = auVar61._0_4_;
                                        auVar130._0_4_ = fVar132 * auVar46._0_4_ + auVar44._0_4_;
                                        auVar130._4_4_ = fVar132 * auVar46._4_4_ + auVar44._4_4_;
                                        auVar130._8_4_ = fVar132 * auVar46._8_4_ + auVar44._8_4_;
                                        auVar130._12_4_ = fVar132 * auVar46._12_4_ + auVar44._12_4_;
                                        auVar125._4_4_ = fVar138;
                                        auVar125._0_4_ = fVar138;
                                        auVar125._8_4_ = fVar138;
                                        auVar125._12_4_ = fVar138;
                                        auVar61 = vmulps_avx512vl(auVar130,auVar125);
                                        bVar9 = (bool)(bVar21 >> 1 & 1);
                                        bVar11 = (bool)(bVar21 >> 2 & 1);
                                        auVar16._8_4_ = 0x219392ef;
                                        auVar16._0_8_ = 0x219392ef219392ef;
                                        auVar16._12_4_ = 0x219392ef;
                                        uVar30 = vcmpps_avx512vl(auVar43,auVar16,5);
                                        auVar43 = vrcp14ps_avx512vl(auVar46);
                                        auVar46 = vfnmadd213ps_avx512vl(auVar46,auVar43,auVar81);
                                        auVar46 = vfmadd132ps_avx512vl(auVar46,auVar43,auVar43);
                                        fVar142 = (float)((uint)((byte)uVar30 & 1) * auVar46._0_4_);
                                        fVar132 = (float)((uint)((byte)(uVar30 >> 1) & 1) *
                                                         auVar46._4_4_);
                                        fVar138 = (float)((uint)((byte)(uVar30 >> 2) & 1) *
                                                         auVar46._8_4_);
                                        fVar144 = (float)((uint)((byte)(uVar30 >> 3) & 1) *
                                                         auVar46._12_4_);
                                        auVar103._0_4_ =
                                             (float)((uint)(bVar21 & 1) * auVar45._0_4_ |
                                                    (uint)!(bool)(bVar21 & 1) * (int)auVar42._0_4_)
                                             * fVar142;
                                        auVar103._4_4_ =
                                             (float)((uint)bVar39 * auVar45._4_4_ |
                                                    (uint)!bVar39 * (int)auVar42._4_4_) * fVar132;
                                        auVar103._8_4_ =
                                             (float)((uint)bVar10 * auVar45._8_4_ |
                                                    (uint)!bVar10 * (int)auVar42._8_4_) * fVar138;
                                        auVar103._12_4_ =
                                             (float)((uint)(bVar21 >> 3) * auVar45._12_4_ |
                                                    (uint)!(bool)(bVar21 >> 3) * (int)auVar42._12_4_
                                                    ) * fVar144;
                                        local_3770 = vminps_avx512vl(auVar103,auVar81);
                                        auVar108._0_4_ =
                                             (float)((uint)(bVar21 & 1) * auVar61._0_4_ |
                                                    (uint)!(bool)(bVar21 & 1) * (int)auVar44._0_4_)
                                             * fVar142;
                                        auVar108._4_4_ =
                                             (float)((uint)bVar9 * auVar61._4_4_ |
                                                    (uint)!bVar9 * (int)auVar44._4_4_) * fVar132;
                                        auVar108._8_4_ =
                                             (float)((uint)bVar11 * auVar61._8_4_ |
                                                    (uint)!bVar11 * (int)auVar44._8_4_) * fVar138;
                                        auVar108._12_4_ =
                                             (float)((uint)(bVar21 >> 3) * auVar61._12_4_ |
                                                    (uint)!(bool)(bVar21 >> 3) * (int)auVar44._12_4_
                                                    ) * fVar144;
                                        local_3760 = vminps_avx512vl(auVar108,auVar81);
                                        local_3750 = vpbroadcastd_avx512vl();
                                        auStack_3790 = auVar69;
                                        local_37a0 = (RTCHitN  [16])auVar68;
                                        local_3780._4_4_ = fVar71;
                                        local_3780._0_4_ = fVar41;
                                        fStack_3778 = fVar72;
                                        fStack_3774 = fVar73;
                                        vpcmpeqd_avx2(ZEXT1632(auVar69),ZEXT1632(auVar69));
                                        uStack_372c = context->user->instID[0];
                                        local_3730 = uStack_372c;
                                        uStack_3728 = uStack_372c;
                                        uStack_3724 = uStack_372c;
                                        uStack_3720 = context->user->instPrimID[0];
                                        uStack_371c = uStack_3720;
                                        uStack_3718 = uStack_3720;
                                        uStack_3714 = uStack_3720;
                                        local_3950 = *(undefined1 (*) [16])(ray + 0x80);
                                        auVar42 = vblendmps_avx512vl(local_3950,auVar119);
                                        bVar39 = (bool)(bVar37 >> 1 & 1);
                                        bVar9 = (bool)(bVar37 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar37 & 1) * auVar42._0_4_ |
                                             !(bool)(bVar37 & 1) * uStack_3720;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar39 * auVar42._4_4_ | !bVar39 * uStack_3720;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar9 * auVar42._8_4_ | !bVar9 * uStack_3720;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)(bVar37 >> 3) * auVar42._12_4_ |
                                             !(bool)(bVar37 >> 3) * uStack_3720;
                                        auVar42 = vpmovm2d_avx512vl((ulong)bVar37);
                                        local_38e0._0_16_ = auVar42;
                                        local_3920.geometryUserPtr = pGVar6->userPtr;
                                        local_3920.valid = (int *)local_38e0;
                                        local_3920.context = context->user;
                                        local_3920.ray = (RTCRayN *)ray;
                                        local_3920.hit = local_37a0;
                                        local_3920.N = 4;
                                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar6->occlusionFilterN)(&local_3920);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar145 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar151 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar150 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar149 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar148 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar147 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar146 = ZEXT1664(auVar42);
                                          ray = local_3968;
                                          auVar42 = local_38e0._0_16_;
                                        }
                                        uVar30 = vptestmd_avx512vl(auVar42,auVar42);
                                        if ((uVar30 & 0xf) == 0) {
                                          uVar30 = 0;
                                        }
                                        else {
                                          p_Var8 = context->args->filter;
                                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var8)(&local_3920);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar145 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                            auVar151 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar150 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar149 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar148 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                            auVar147 = ZEXT1664(auVar42);
                                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar146 = ZEXT1664(auVar42);
                                            ray = local_3968;
                                            auVar42 = local_38e0._0_16_;
                                          }
                                          uVar30 = vptestmd_avx512vl(auVar42,auVar42);
                                          uVar30 = uVar30 & 0xf;
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar39 = (bool)((byte)uVar30 & 1);
                                          bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                                          bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
                                          bVar11 = SUB81(uVar30 >> 3,0);
                                          *(uint *)(local_3920.ray + 0x80) =
                                               (uint)bVar39 * auVar42._0_4_ |
                                               (uint)!bVar39 * *(int *)(local_3920.ray + 0x80);
                                          *(uint *)(local_3920.ray + 0x84) =
                                               (uint)bVar9 * auVar42._4_4_ |
                                               (uint)!bVar9 * *(int *)(local_3920.ray + 0x84);
                                          *(uint *)(local_3920.ray + 0x88) =
                                               (uint)bVar10 * auVar42._8_4_ |
                                               (uint)!bVar10 * *(int *)(local_3920.ray + 0x88);
                                          *(uint *)(local_3920.ray + 0x8c) =
                                               (uint)bVar11 * auVar42._12_4_ |
                                               (uint)!bVar11 * *(int *)(local_3920.ray + 0x8c);
                                        }
                                        bVar37 = (byte)uVar30;
                                        bVar39 = (bool)((byte)(uVar30 >> 1) & 1);
                                        bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
                                        bVar10 = SUB81(uVar30 >> 3,0);
                                        *(uint *)local_3938 =
                                             (uint)(bVar37 & 1) * *(int *)local_3938 |
                                             (uint)!(bool)(bVar37 & 1) * local_3950._0_4_;
                                        *(uint *)(local_3938 + 4) =
                                             (uint)bVar39 * *(int *)(local_3938 + 4) |
                                             (uint)!bVar39 * local_3950._4_4_;
                                        *(uint *)(local_3938 + 8) =
                                             (uint)bVar9 * *(int *)(local_3938 + 8) |
                                             (uint)!bVar9 * local_3950._8_4_;
                                        *(uint *)(local_3938 + 0xc) =
                                             (uint)bVar10 * *(int *)(local_3938 + 0xc) |
                                             (uint)!bVar10 * local_3950._12_4_;
                                      }
                                      bVar23 = (bVar37 ^ 0xf) & bVar23;
                                      lVar33 = local_3960;
                                    }
                                  }
                                }
                              }
                              if (bVar23 == 0) break;
                              puVar29 = puVar29 + 0x10;
                              bVar39 = uVar32 < 3;
                              uVar32 = uVar32 + 1;
                            } while (bVar39);
                            bVar27 = bVar27 & bVar23;
                            bVar39 = bVar27 == 0;
                            lVar26 = local_38a0;
                            uVar30 = local_3898;
                            puVar31 = local_3930;
                            uVar32 = local_38f0;
                          }
                        } while ((!bVar39) && (uVar30 = uVar30 - 1 & uVar30, uVar30 != 0));
                      }
                      lVar26 = local_38a8 + 1;
                    } while (lVar26 != local_38b0);
                    bVar27 = ~bVar27 & 0xf;
                  }
                  local_3988 = local_3988 | bVar27;
                  uVar36 = (ushort)local_3988;
                  if (local_3988 == 0xf) {
                    local_3988 = 0xf;
                    goto LAB_0077ad21;
                  }
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar39 = (bool)(local_3988 >> 1 & 1);
                  bVar9 = (bool)(local_3988 >> 2 & 1);
                  bVar10 = (bool)(local_3988 >> 3 & 1);
                  local_37b0._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_37b0._4_4_
                  ;
                  local_37b0._0_4_ =
                       (uint)(local_3988 & 1) * auVar42._0_4_ |
                       (uint)!(bool)(local_3988 & 1) * local_37b0._0_4_;
                  local_37b0._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * local_37b0._8_4_;
                  local_37b0._12_4_ =
                       (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * local_37b0._12_4_;
                }
                goto LAB_007796f6;
              }
              lVar26 = 0;
              auVar42 = auVar148._0_16_;
              do {
                uVar30 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar26 * 8);
                if (uVar30 == 8) {
                  auVar89 = ZEXT1664(auVar42);
                  local_3930 = puVar31;
                  break;
                }
                uVar38 = *(undefined4 *)(root.ptr + 0x40 + lVar26 * 4);
                auVar46._4_4_ = uVar38;
                auVar46._0_4_ = uVar38;
                auVar46._8_4_ = uVar38;
                auVar46._12_4_ = uVar38;
                auVar43._8_8_ = local_3880._8_8_;
                auVar43._0_8_ = local_3880._0_8_;
                auVar44._8_8_ = local_3880._24_8_;
                auVar44._0_8_ = local_3880._16_8_;
                auVar45._8_8_ = local_3880._40_8_;
                auVar45._0_8_ = local_3880._32_8_;
                auVar46 = vsubps_avx(auVar46,auVar43);
                auVar50._0_4_ = (float)local_3820._0_4_ * auVar46._0_4_;
                auVar50._4_4_ = (float)local_3820._4_4_ * auVar46._4_4_;
                auVar50._8_4_ = fStack_3818 * auVar46._8_4_;
                auVar50._12_4_ = fStack_3814 * auVar46._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0x80 + lVar26 * 4);
                auVar81._4_4_ = uVar38;
                auVar81._0_4_ = uVar38;
                auVar81._8_4_ = uVar38;
                auVar81._12_4_ = uVar38;
                auVar46 = vsubps_avx(auVar81,auVar44);
                auVar51._0_4_ = local_3810._0_4_ * auVar46._0_4_;
                auVar51._4_4_ = local_3810._4_4_ * auVar46._4_4_;
                auVar51._8_4_ = local_3810._8_4_ * auVar46._8_4_;
                auVar51._12_4_ = local_3810._12_4_ * auVar46._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xc0 + lVar26 * 4);
                auVar70._4_4_ = uVar38;
                auVar70._0_4_ = uVar38;
                auVar70._8_4_ = uVar38;
                auVar70._12_4_ = uVar38;
                auVar46 = vsubps_avx(auVar70,auVar45);
                auVar52._0_4_ = local_3800._0_4_ * auVar46._0_4_;
                auVar52._4_4_ = local_3800._4_4_ * auVar46._4_4_;
                auVar52._8_4_ = local_3800._8_4_ * auVar46._8_4_;
                auVar52._12_4_ = local_3800._12_4_ * auVar46._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0x60 + lVar26 * 4);
                auVar82._4_4_ = uVar38;
                auVar82._0_4_ = uVar38;
                auVar82._8_4_ = uVar38;
                auVar82._12_4_ = uVar38;
                auVar46 = vsubps_avx(auVar82,auVar43);
                auVar47._0_4_ = (float)local_3820._0_4_ * auVar46._0_4_;
                auVar47._4_4_ = (float)local_3820._4_4_ * auVar46._4_4_;
                auVar47._8_4_ = fStack_3818 * auVar46._8_4_;
                auVar47._12_4_ = fStack_3814 * auVar46._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xa0 + lVar26 * 4);
                auVar60._4_4_ = uVar38;
                auVar60._0_4_ = uVar38;
                auVar60._8_4_ = uVar38;
                auVar60._12_4_ = uVar38;
                auVar46 = vsubps_avx(auVar60,auVar44);
                auVar48._0_4_ = local_3810._0_4_ * auVar46._0_4_;
                auVar48._4_4_ = local_3810._4_4_ * auVar46._4_4_;
                auVar48._8_4_ = local_3810._8_4_ * auVar46._8_4_;
                auVar48._12_4_ = local_3810._12_4_ * auVar46._12_4_;
                uVar38 = *(undefined4 *)(root.ptr + 0xe0 + lVar26 * 4);
                auVar57._4_4_ = uVar38;
                auVar57._0_4_ = uVar38;
                auVar57._8_4_ = uVar38;
                auVar57._12_4_ = uVar38;
                auVar46 = vsubps_avx(auVar57,auVar45);
                auVar49._0_4_ = local_3800._0_4_ * auVar46._0_4_;
                auVar49._4_4_ = local_3800._4_4_ * auVar46._4_4_;
                auVar49._8_4_ = local_3800._8_4_ * auVar46._8_4_;
                auVar49._12_4_ = local_3800._12_4_ * auVar46._12_4_;
                auVar46 = vminps_avx(auVar50,auVar47);
                auVar43 = vminps_avx(auVar51,auVar48);
                auVar46 = vmaxps_avx(auVar46,auVar43);
                auVar43 = vminps_avx(auVar52,auVar49);
                auVar46 = vmaxps_avx(auVar46,auVar43);
                auVar44 = vmulps_avx512vl(auVar46,auVar149._0_16_);
                auVar46 = vmaxps_avx(auVar50,auVar47);
                auVar43 = vmaxps_avx(auVar51,auVar48);
                auVar43 = vminps_avx(auVar46,auVar43);
                auVar46 = vmaxps_avx(auVar52,auVar49);
                auVar46 = vminps_avx(auVar43,auVar46);
                auVar43 = vmulps_avx512vl(auVar46,auVar150._0_16_);
                auVar46 = vmaxps_avx(auVar44,local_37c0);
                auVar43 = vminps_avx(auVar43,local_37b0);
                uVar25 = vcmpps_avx512vl(auVar46,auVar43,2);
                if ((byte)uVar25 == 0) {
                  auVar89 = ZEXT1664(auVar42);
                  uVar30 = uVar40;
                }
                else {
                  auVar46 = vblendmps_avx512vl(auVar148._0_16_,auVar44);
                  bVar39 = (bool)((byte)uVar25 & 1);
                  bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar11 = (bool)((byte)(uVar25 >> 3) & 1);
                  auVar89 = ZEXT1664(CONCAT412((uint)bVar11 * auVar46._12_4_ |
                                               (uint)!bVar11 * auVar44._12_4_,
                                               CONCAT48((uint)bVar10 * auVar46._8_4_ |
                                                        (uint)!bVar10 * auVar44._8_4_,
                                                        CONCAT44((uint)bVar9 * auVar46._4_4_ |
                                                                 (uint)!bVar9 * auVar44._4_4_,
                                                                 (uint)bVar39 * auVar46._0_4_ |
                                                                 (uint)!bVar39 * auVar44._0_4_))));
                  if (uVar40 != 8) {
                    *puVar31 = uVar40;
                    puVar31 = puVar31 + 1;
                    *pauVar35 = auVar42;
                    pauVar35 = pauVar35 + 1;
                  }
                }
                uVar40 = uVar30;
                lVar26 = lVar26 + 1;
                auVar42 = auVar89._0_16_;
                local_3930 = puVar31;
              } while (lVar26 != 8);
              if (uVar40 == 8) goto LAB_007798cf;
              uVar12 = vcmpps_avx512vl(auVar89._0_16_,local_37b0,9);
              puVar31 = local_3930;
              root.ptr = uVar40;
            } while ((byte)uVar32 < (byte)POPCOUNT((int)uVar12));
            *local_3930 = uVar40;
            local_3930 = local_3930 + 1;
            *pauVar35 = auVar89._0_16_;
            pauVar35 = pauVar35 + 1;
LAB_007798cf:
            iVar24 = 4;
          }
          else {
            do {
              local_3950 = auVar42;
              k = 0;
              for (uVar32 = uVar40; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              bVar39 = occluded1(local_38b8,local_38c0,root,k,&local_3969,ray,
                                 (TravRayK<4,_true> *)&local_3880.field_0,context);
              bVar27 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar39) {
                bVar27 = 0;
              }
              bVar27 = (byte)uVar36 | bVar27;
              uVar36 = (ushort)bVar27;
              uVar40 = uVar40 - 1 & uVar40;
              ray = local_3968;
              auVar42 = local_3950;
            } while (uVar40 != 0);
            iVar24 = 3;
            uVar36 = (ushort)bVar27;
            if (bVar27 != 0xf) {
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar39 = (bool)(bVar27 >> 1 & 1);
              bVar9 = (bool)(bVar27 >> 2 & 1);
              bVar10 = (bool)(bVar27 >> 3 & 1);
              local_37b0._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_37b0._4_4_;
              local_37b0._0_4_ =
                   (uint)(bVar27 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar27 & 1) * local_37b0._0_4_
              ;
              local_37b0._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * local_37b0._8_4_;
              local_37b0._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * local_37b0._12_4_;
              iVar24 = 2;
            }
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar146 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar147 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar148 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar149 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar150 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar151 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar145 = ZEXT1664(auVar42);
            auVar89 = ZEXT1664(local_3950);
            puVar31 = local_3930;
            uVar32 = local_38f0;
            if (local_38f0 < (uint)POPCOUNT(uVar38)) goto LAB_0077973f;
          }
          local_3988 = (byte)uVar36;
          puVar31 = local_3930;
          if (iVar24 == 3) {
LAB_0077ad21:
            local_3988 = local_3988 & (byte)local_3924;
            bVar39 = (bool)(local_3988 >> 1 & 1);
            bVar9 = (bool)(local_3988 >> 2 & 1);
            bVar10 = (bool)(local_3988 >> 3 & 1);
            *(uint *)local_3938 =
                 (uint)(local_3988 & 1) * -0x800000 |
                 (uint)!(bool)(local_3988 & 1) * *(int *)local_3938;
            *(uint *)(local_3938 + 4) =
                 (uint)bVar39 * -0x800000 | (uint)!bVar39 * *(int *)(local_3938 + 4);
            *(uint *)(local_3938 + 8) =
                 (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_3938 + 8);
            *(uint *)(local_3938 + 0xc) =
                 (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_3938 + 0xc);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }